

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O1

void __thiscall proto3_arena_unittest::ForeignMessage::Clear(ForeignMessage *this)

{
  (this->field_0)._impl_.c_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void ForeignMessage::Clear() {
// @@protoc_insertion_point(message_clear_start:proto3_arena_unittest.ForeignMessage)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.c_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}